

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O3

void POLYEV(int NN,double *SR,double *SI,double *PR,double *PI,double *QR,double *QI,double *PVR,
           double *PVI)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  *QR = *PR;
  *QI = *PI;
  *PVR = *QR;
  dVar2 = *QI;
  *PVI = dVar2;
  if (1 < NN) {
    uVar1 = 1;
    do {
      dVar3 = (*PVR * *SR - *SI * dVar2) + PR[uVar1];
      *PVI = *PVR * *SI + *SR * dVar2 + PI[uVar1];
      *PVR = dVar3;
      QR[uVar1] = dVar3;
      dVar2 = *PVI;
      QI[uVar1] = dVar2;
      uVar1 = uVar1 + 1;
    } while ((uint)NN != uVar1);
  }
  return;
}

Assistant:

static void POLYEV(int NN, double *SR, double *SI,double *PR, double *PI, double *QR, double *QI, double *PVR, double *PVI) {
	double T;
	int i;
	QR[0] = PR[0];
	QI[0] = PI[0];
	*PVR = QR[0];
	*PVI = QI[0];

	for (i = 1; i < NN; ++i) {
		T = *PVR * *SR - *PVI * *SI + PR[i];
		*PVI = *PVR * *SI + *PVI * *SR + PI[i];
		*PVR = T;
		QR[i] = *PVR;
		QI[i] = *PVI;
	}
}